

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testoverlay.c
# Opt level: O1

void ConvertRGBtoUYVY(SDL_Surface *s,SDL_Overlay *o,int monochrome,int luminance)

{
  Uint8 *pUVar1;
  int iVar2;
  Uint8 *rgb;
  uint uVar3;
  int yuv [3];
  Uint8 local_3c [4];
  Uint8 local_38;
  Uint8 local_34;
  
  SDL_LockSurface();
  SDL_LockYUVOverlay(o);
  if (0 < s->h) {
    iVar2 = 0;
    do {
      if (o->h <= iVar2) break;
      if (0 < s->w) {
        pUVar1 = *o->pixels + (uint)*o->pitches * iVar2;
        rgb = (Uint8 *)((ulong)((uint)s->pitch * iVar2) + (long)s->pixels);
        uVar3 = 0;
        do {
          if (o->w <= (int)uVar3) break;
          RGBtoYUV(rgb,(int *)local_3c,monochrome,luminance);
          if ((uVar3 & 1) == 0) {
            *pUVar1 = local_38;
            pUVar1[1] = local_3c[0];
            pUVar1[2] = local_34;
            pUVar1 = pUVar1 + 3;
          }
          else {
            *pUVar1 = local_3c[0];
            pUVar1 = pUVar1 + 1;
          }
          rgb = rgb + s->format->BytesPerPixel;
          uVar3 = uVar3 + 1;
        } while ((int)uVar3 < s->w);
      }
      iVar2 = iVar2 + 1;
    } while (iVar2 < s->h);
  }
  SDL_UnlockYUVOverlay(o);
  SDL_UnlockSurface(s);
  return;
}

Assistant:

void ConvertRGBtoUYVY(SDL_Surface *s, SDL_Overlay *o, int monochrome, int luminance)
{
	int x,y;
	int yuv[3];
	Uint8 *p,*op;

	SDL_LockSurface(s);
	SDL_LockYUVOverlay(o);

	for(y=0; y<s->h && y<o->h; y++)
	{
		p=((Uint8 *) s->pixels)+s->pitch*y;
		op=o->pixels[0]+o->pitches[0]*y;
		for(x=0; x<s->w && x<o->w; x++)
		{
			RGBtoYUV(p, yuv, monochrome, luminance);
			if(x%2==0)
			{
				*(op++)=yuv[1];
				*(op++)=yuv[0];
				*(op++)=yuv[2];
			}
			else
				*(op++)=yuv[0];

			p+=s->format->BytesPerPixel;
		}
	}

	SDL_UnlockYUVOverlay(o);
	SDL_UnlockSurface(s);
}